

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O3

bool Pl_Flate::zopfli_check_env(QPDFLogger *logger)

{
  bool bVar1;
  int iVar2;
  runtime_error *this;
  bool bVar3;
  string value;
  string local_68;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"QPDF_ZOPFLI","");
  bVar1 = QUtil::get_env(&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  bVar3 = true;
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_48);
      if (iVar2 != 0) {
        if (logger == (QPDFLogger *)0x0) {
          QPDFLogger::defaultLogger();
          logger = (QPDFLogger *)local_68._M_dataplus._M_p;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
          }
        }
        iVar2 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar2 == 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this,"QPDF_ZOPFLI=force, and zopfli support is not enabled");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        QPDFLogger::warn(logger,
                         "QPDF_ZOPFLI is set, but libqpdf was not built with zopfli support\n");
        QPDFLogger::warn(logger,
                         "Set QPDF_ZOPFLI=silent to suppress this warning and use zopfli when available.\n"
                        );
        bVar3 = false;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool
Pl_Flate::zopfli_check_env(QPDFLogger* logger)
{
    if (Pl_Flate::zopfli_supported()) {
        return true;
    }
    std::string value;
    auto is_set = QUtil::get_env("QPDF_ZOPFLI", &value);
    if (!is_set || value == "disabled" || value == "silent") {
        return true;
    }
    if (!logger) {
        logger = QPDFLogger::defaultLogger().get();
    }

    // This behavior is known in QPDFJob (for the --zopfli argument), Pl_Flate.hh, README.md,
    // and the manual. Do a case-insensitive search for zopfli if changing the behavior.
    if (value == "force") {
        throw std::runtime_error("QPDF_ZOPFLI=force, and zopfli support is not enabled");
    }
    logger->warn("QPDF_ZOPFLI is set, but libqpdf was not built with zopfli support\n");
    logger->warn(
        "Set QPDF_ZOPFLI=silent to suppress this warning and use zopfli when available.\n");
    return false;
}